

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_or_allocate_builtin_output_member_location
          (CompilerMSL *this,BuiltIn builtin,uint32_t type_id,uint32_t index,uint32_t *comp)

{
  bool bVar1;
  uint32_t id;
  SPIRType *pSVar2;
  TypedID *this_00;
  mapped_type *pmVar3;
  BuiltIn local_60;
  key_type local_5c [2];
  TypeID local_54;
  anon_class_8_1_8991fb9c local_50;
  anon_class_8_1_8991fb9c location_range_in_use;
  uint32_t count;
  SPIRType *mbr_type;
  uint32_t loc;
  uint32_t *comp_local;
  uint32_t index_local;
  uint32_t type_id_local;
  BuiltIn builtin_local;
  CompilerMSL *this_local;
  
  this_local._4_4_ = get_member_location(this,type_id,index,comp);
  if (this_local._4_4_ == 0xffffffff) {
    mbr_type._4_4_ = 0;
    if (comp != (uint32_t *)0x0) {
      *comp = 0xffffffff;
    }
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(pSVar2->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)index);
    id = TypedID::operator_cast_to_unsigned_int(this_00);
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
    location_range_in_use.this._4_4_ =
         CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar2);
    local_50.this = this;
    while (bVar1 = get_or_allocate_builtin_output_member_location::anon_class_8_1_8991fb9c::
                   operator()(&local_50,mbr_type._4_4_,location_range_in_use.this._4_4_), bVar1) {
      mbr_type._4_4_ = mbr_type._4_4_ + 1;
    }
    TypedID<(spirv_cross::Types)1>::TypedID(&local_54,type_id);
    Compiler::set_member_decoration
              ((Compiler *)this,local_54,index,DecorationLocation,mbr_type._4_4_);
    bVar1 = Compiler::is_tessellating_triangles((Compiler *)this);
    if ((bVar1) && ((builtin == BuiltInTessLevelInner || (builtin == BuiltInTessLevelOuter)))) {
      local_5c[1] = 0xc;
      pmVar3 = ::std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->builtin_to_automatic_output_location,local_5c + 1);
      *pmVar3 = mbr_type._4_4_;
      local_5c[0] = 0xb;
      pmVar3 = ::std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->builtin_to_automatic_output_location,local_5c);
      *pmVar3 = mbr_type._4_4_;
    }
    else {
      local_60 = builtin;
      pmVar3 = ::std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->builtin_to_automatic_output_location,&local_60);
      *pmVar3 = mbr_type._4_4_;
    }
    mark_location_as_used_by_shader(this,mbr_type._4_4_,pSVar2,StorageClassOutput,true);
    this_local._4_4_ = mbr_type._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_or_allocate_builtin_output_member_location(spv::BuiltIn builtin,
                                                                     uint32_t type_id, uint32_t index,
                                                                     uint32_t *comp)
{
	uint32_t loc = get_member_location(type_id, index, comp);
	if (loc != k_unknown_location)
		return loc;
	loc = 0;

	if (comp)
		*comp = k_unknown_component;

	// Late allocation. Find a location which is unused by the application.
	// This can happen for built-in outputs in tessellation which are mixed and matched with user inputs.
	auto &mbr_type = get<SPIRType>(get<SPIRType>(type_id).member_types[index]);
	uint32_t count = type_to_location_count(mbr_type);

	const auto location_range_in_use = [this](uint32_t location, uint32_t location_count) -> bool {
		for (uint32_t i = 0; i < location_count; i++)
			if (location_outputs_in_use.count(location + i) != 0)
				return true;
		return false;
	};

	while (location_range_in_use(loc, count))
		loc++;

	set_member_decoration(type_id, index, DecorationLocation, loc);

	// Triangle tess level inputs are shared in one packed float4;
	// mark both builtins as sharing one location.
	if (is_tessellating_triangles() && (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter))
	{
		builtin_to_automatic_output_location[BuiltInTessLevelInner] = loc;
		builtin_to_automatic_output_location[BuiltInTessLevelOuter] = loc;
	}
	else
		builtin_to_automatic_output_location[builtin] = loc;

	mark_location_as_used_by_shader(loc, mbr_type, StorageClassOutput, true);
	return loc;
}